

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putcontig8bitYCbCr22tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  byte bVar2;
  TIFFRGBAImage *pTVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  uint Cr;
  byte *pbVar7;
  uint *puVar8;
  uint Cb;
  long lVar9;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint local_6c;
  TIFFRGBAImage *local_68;
  uint *local_60;
  uint *local_58;
  uint local_4c;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_38 = (ulong)w;
  local_60 = cp + local_38 + (long)toskew;
  local_40 = (long)(int)(w + toskew * 2);
  local_48 = (long)((fromskew / 2) * 6);
  local_68 = img;
  while (pTVar3 = local_68, 1 < h) {
    lVar9 = 0;
    uVar5 = local_38 & 0xffffffff;
    local_6c = h;
    local_58 = cp;
    while (pTVar3 = local_68, uVar4 = (uint)uVar5, 1 < uVar4) {
      bVar1 = pp[4];
      Cb = (uint)bVar1;
      bVar2 = pp[5];
      Cr = (uint)bVar2;
      local_4c = uVar4;
      TIFFYCbCrtoRGB(local_68->ycbcr,(uint)*pp,Cb,Cr,&r,&g,&b);
      puVar6 = local_58;
      *(uint32_t *)((long)local_58 + lVar9) = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[1],(uint)bVar1,(uint)bVar2,&r,&g,&b);
      *(uint32_t *)((long)puVar6 + lVar9 + 4) = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[2],Cb,Cr,&r,&g,&b);
      puVar6 = local_60;
      *(uint32_t *)((long)local_60 + lVar9) = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[3],Cb,Cr,&r,&g,&b);
      *(uint32_t *)((long)puVar6 + lVar9 + 4) = b << 0x10 | 0xff000000 | g << 8 | r;
      pp = pp + 6;
      lVar9 = lVar9 + 8;
      uVar5 = (ulong)(local_4c - 2);
    }
    if (uVar4 == 1) {
      bVar1 = pp[4];
      bVar2 = pp[5];
      TIFFYCbCrtoRGB(local_68->ycbcr,(uint)*pp,(uint)bVar1,(uint)bVar2,&r,&g,&b);
      puVar8 = (uint *)((long)local_58 + lVar9) + 1;
      *(uint *)((long)local_58 + lVar9) = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[2],(uint)bVar1,(uint)bVar2,&r,&g,&b);
      puVar6 = (uint *)((long)local_60 + lVar9) + 1;
      *(uint *)((long)local_60 + lVar9) = b << 0x10 | 0xff000000 | g << 8 | r;
      pp = pp + 6;
    }
    else {
      puVar6 = (uint *)((long)local_60 + lVar9);
      puVar8 = (uint *)((long)local_58 + lVar9);
    }
    pp = pp + local_48;
    cp = puVar8 + local_40;
    local_60 = puVar6 + local_40;
    h = local_6c - 2;
  }
  if (h == 1) {
    pbVar7 = pp + 5;
    uVar5 = local_38;
    while (uVar4 = (uint)uVar5, 1 < uVar4) {
      bVar1 = pbVar7[-1];
      bVar2 = *pbVar7;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pbVar7[-5],(uint)bVar1,(uint)bVar2,&r,&g,&b);
      *cp = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pbVar7[-4],(uint)bVar1,(uint)bVar2,&r,&g,&b);
      cp[1] = b << 0x10 | 0xff000000 | g << 8 | r;
      cp = cp + 2;
      pbVar7 = pbVar7 + 6;
      uVar5 = (ulong)(uVar4 - 2);
    }
    if (uVar4 == 1) {
      TIFFYCbCrtoRGB(local_68->ycbcr,(uint)pbVar7[-5],(uint)pbVar7[-1],(uint)*pbVar7,&r,&g,&b);
      *cp = g << 8 | r | b << 0x10 | 0xff000000;
    }
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr22tile)
{
    uint32_t *cp2;
    int32_t incr = 2 * toskew + w;
    (void)y;
    fromskew = (fromskew / 2) * (2 * 2 + 2);
    cp2 = cp + w + toskew;
    while (h >= 2)
    {
        x = w;
        while (x >= 2)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            YCbCrtoRGB(cp2[0], pp[2]);
            YCbCrtoRGB(cp2[1], pp[3]);
            cp += 2;
            cp2 += 2;
            pp += 6;
            x -= 2;
        }
        if (x == 1)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp2[0], pp[2]);
            cp++;
            cp2++;
            pp += 6;
        }
        cp += incr;
        cp2 += incr;
        pp += fromskew;
        h -= 2;
    }
    if (h == 1)
    {
        x = w;
        while (x >= 2)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            cp += 2;
            cp2 += 2;
            pp += 6;
            x -= 2;
        }
        if (x == 1)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
        }
    }
}